

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_functional_test.cc
# Opt level: O2

void open_multi_files_kvs_test(void)

{
  fdb_kvs_handle *pfVar1;
  fdb_status fVar2;
  int iVar3;
  size_t sVar4;
  size_t sVar5;
  fdb_kvs_handle **ppfVar6;
  char *__format;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  fdb_iterator *iterator;
  fdb_doc *rdoc;
  ulong local_44e0;
  fdb_kvs_handle **local_44d8;
  fdb_kvs_config kvs_config;
  fdb_file_handle *local_44b8 [8];
  fdb_kvs_info kvs_info;
  timeval __test_begin;
  char keybuf [256];
  fdb_config fconfig;
  char fname [256];
  char bodybuf [256];
  fdb_kvs_handle *local_4038 [1024];
  fdb_kvs_handle *local_2038 [1025];
  
  gettimeofday((timeval *)&__test_begin,(__timezone_ptr_t)0x0);
  memleak_start();
  system("rm -rf  dummy* > errorlog.txt");
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  fconfig.wal_threshold = 0x400;
  fconfig.compaction_mode = '\0';
  fconfig.durability_opt = '\x02';
  ppfVar6 = local_4038;
  iVar3 = 0;
  uVar8 = 0;
  while( true ) {
    if (uVar8 == 8) {
      lVar7 = 0;
      do {
        if (lVar7 == 0x400) {
          uVar8 = 0;
          do {
            if (uVar8 == 8) {
              ppfVar6 = local_2038;
              uVar8 = 0;
              do {
                if (0x3ff < uVar8) {
                  lVar7 = 0;
                  do {
                    if (lVar7 == 8) {
                      rdoc = (fdb_doc *)0x0;
                      uVar8 = 0;
                      do {
                        if (0x3ff < uVar8) {
                          fdb_doc_free(rdoc);
                          lVar7 = 0;
                          do {
                            if (lVar7 == 0x400) {
                              uVar8 = 0;
                              do {
                                if (uVar8 == 8) {
                                  rdoc = (fdb_doc *)0x0;
                                  uVar8 = 0;
                                  while( true ) {
                                    if (0x3ff < uVar8) {
                                      fdb_doc_free(rdoc);
                                      lVar7 = 0;
                                      do {
                                        if (lVar7 == 8) {
                                          fdb_shutdown();
                                          memleak_end();
                                          __format = "%s PASSED\n";
                                          if (open_multi_files_kvs_test()::__test_pass != '\0') {
                                            __format = "%s FAILED\n";
                                          }
                                          fprintf(_stderr,__format,"open multi files kvs test");
                                          return;
                                        }
                                        fVar2 = fdb_close(local_44b8[lVar7]);
                                        lVar7 = lVar7 + 1;
                                      } while (fVar2 == FDB_RESULT_SUCCESS);
                                      fprintf(_stderr,"Test failed: %s %d\n",
                                              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                                              ,0x10fe);
                                      open_multi_files_kvs_test()::__test_pass = 1;
                                      __assert_fail("status == FDB_RESULT_SUCCESS",
                                                                                                        
                                                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                                                  ,0x10fe,"void open_multi_files_kvs_test()");
                                    }
                                    fVar2 = fdb_iterator_init(local_4038[uVar8],&iterator,
                                                              (void *)0x0,0,(void *)0x0,0,2);
                                    if (fVar2 != FDB_RESULT_SUCCESS) break;
                                    do {
                                      fVar2 = fdb_iterator_get(iterator,&rdoc);
                                      if (fVar2 == FDB_RESULT_SUCCESS) {
                                        fprintf(_stderr,"Test failed: %s %d\n",
                                                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                                                ,0x10f4);
                                        open_multi_files_kvs_test()::__test_pass = 1;
                                        __assert_fail("status != FDB_RESULT_SUCCESS",
                                                                                                            
                                                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                                                  ,0x10f4,"void open_multi_files_kvs_test()");
                                      }
                                      fVar2 = fdb_iterator_next(iterator);
                                    } while (fVar2 != FDB_RESULT_ITERATOR_FAIL);
                                    fdb_iterator_close(iterator);
                                    uVar8 = uVar8 + 0x80;
                                  }
                                  fprintf(_stderr,"Test failed: %s %d\n",
                                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                                          ,0x10f0);
                                  open_multi_files_kvs_test()::__test_pass = 1;
                                  __assert_fail("status == FDB_RESULT_SUCCESS",
                                                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                                                ,0x10f0,"void open_multi_files_kvs_test()");
                                }
                                sprintf(fname,"dummy_compact%d",uVar8 & 0xffffffff);
                                fVar2 = fdb_compact(local_44b8[uVar8],fname);
                                uVar8 = uVar8 + 1;
                              } while (fVar2 == FDB_RESULT_SUCCESS);
                              fprintf(_stderr,"Test failed: %s %d\n",
                                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                                      ,0x10e9);
                              open_multi_files_kvs_test()::__test_pass = 1;
                              __assert_fail("status == FDB_RESULT_SUCCESS",
                                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                                            ,0x10e9,"void open_multi_files_kvs_test()");
                            }
                            uVar8 = 0;
                            while ((int)uVar8 != 10) {
                              sprintf(keybuf,"key%08d",uVar8);
                              pfVar1 = local_4038[lVar7];
                              sVar4 = strlen(keybuf);
                              fVar2 = fdb_del_kv(pfVar1,keybuf,sVar4 + 1);
                              uVar8 = (ulong)((int)uVar8 + 1);
                              if (fVar2 != FDB_RESULT_SUCCESS) {
                                fprintf(_stderr,"Test failed: %s %d\n",
                                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                                        ,0x10e0);
                                open_multi_files_kvs_test()::__test_pass = 1;
                                __assert_fail("status == FDB_RESULT_SUCCESS",
                                              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                                              ,0x10e0,"void open_multi_files_kvs_test()");
                              }
                            }
                            lVar7 = lVar7 + 1;
                          } while( true );
                        }
                        uVar9 = 0;
                        fdb_iterator_init(local_2038[uVar8],&iterator,(void *)0x0,0,(void *)0x0,0,0)
                        ;
                        do {
                          fVar2 = fdb_iterator_get(iterator,&rdoc);
                          if (fVar2 != FDB_RESULT_SUCCESS) {
                            fprintf(_stderr,"Test failed: %s %d\n",
                                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                                    ,0x10d1);
                            open_multi_files_kvs_test()::__test_pass = 1;
                            __assert_fail("status == FDB_RESULT_SUCCESS",
                                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                                          ,0x10d1,"void open_multi_files_kvs_test()");
                          }
                          sprintf(keybuf,"key%08d",uVar9);
                          iVar3 = strcmp(keybuf,(char *)rdoc->key);
                          if (iVar3 != 0) {
                            fprintf(_stderr,"Test failed: %s %d\n",
                                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                                   );
                            open_multi_files_kvs_test()::__test_pass = '\x01';
                            iVar3 = strcmp(keybuf,(char *)rdoc->key);
                            if (iVar3 != 0) {
                              __assert_fail("!strcmp(keybuf, (char *)rdoc->key)",
                                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                                            ,0x10d3,"void open_multi_files_kvs_test()");
                            }
                          }
                          uVar9 = (ulong)((int)uVar9 + 1);
                          fVar2 = fdb_iterator_next(iterator);
                        } while (fVar2 != FDB_RESULT_ITERATOR_FAIL);
                        fdb_iterator_close(iterator);
                        uVar8 = uVar8 + 0x80;
                      } while( true );
                    }
                    fVar2 = fdb_compact(local_44b8[lVar7],(char *)0x0);
                    lVar7 = lVar7 + 1;
                  } while (fVar2 == FDB_RESULT_SUCCESS);
                  fprintf(_stderr,"Test failed: %s %d\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                          ,0x10c6);
                  open_multi_files_kvs_test()::__test_pass = 1;
                  __assert_fail("status == FDB_RESULT_SUCCESS",
                                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                                ,0x10c6,"void open_multi_files_kvs_test()");
                }
                fdb_get_kvs_info(local_4038[uVar8],&kvs_info);
                if (kvs_info.last_seqnum != 10) {
                  fprintf(_stderr,"Test failed: %s %d\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                         );
                  open_multi_files_kvs_test()::__test_pass = '\x01';
                  if (kvs_info.last_seqnum != 10) {
                    __assert_fail("kvs_info.last_seqnum == (uint64_t)n",
                                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                                  ,0x10be,"void open_multi_files_kvs_test()");
                  }
                }
                fVar2 = fdb_snapshot_open(local_4038[uVar8],ppfVar6,10);
                uVar8 = uVar8 + 0x80;
                ppfVar6 = ppfVar6 + 0x80;
              } while (fVar2 == FDB_RESULT_SUCCESS);
              fprintf(_stderr,"Test failed: %s %d\n",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0x10c0);
              open_multi_files_kvs_test()::__test_pass = 1;
              __assert_fail("status == FDB_RESULT_SUCCESS",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                            ,0x10c0,"void open_multi_files_kvs_test()");
            }
            if ((uVar8 & 1) == 0) {
              fVar2 = fdb_commit(local_44b8[uVar8],'\0');
              if (fVar2 != FDB_RESULT_SUCCESS) {
                fprintf(_stderr,"Test failed: %s %d\n",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                        ,0x10b4);
                open_multi_files_kvs_test()::__test_pass = 1;
                __assert_fail("status == FDB_RESULT_SUCCESS",
                              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                              ,0x10b4,"void open_multi_files_kvs_test()");
              }
            }
            else {
              fVar2 = fdb_commit(local_44b8[uVar8],'\x01');
              if (fVar2 != FDB_RESULT_SUCCESS) {
                fprintf(_stderr,"Test failed: %s %d\n",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                        ,0x10b7);
                open_multi_files_kvs_test()::__test_pass = 1;
                __assert_fail("status == FDB_RESULT_SUCCESS",
                              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                              ,0x10b7,"void open_multi_files_kvs_test()");
              }
            }
            uVar8 = uVar8 + 1;
          } while( true );
        }
        uVar8 = 0;
        while ((int)uVar8 != 10) {
          sprintf(keybuf,"key%08d",uVar8);
          sprintf(bodybuf,"value%08d",uVar8);
          pfVar1 = local_4038[lVar7];
          sVar4 = strlen(keybuf);
          sVar5 = strlen(bodybuf);
          fVar2 = fdb_set_kv(pfVar1,keybuf,sVar4 + 1,bodybuf,sVar5 + 1);
          uVar8 = (ulong)((int)uVar8 + 1);
          if (fVar2 != FDB_RESULT_SUCCESS) {
            fprintf(_stderr,"Test failed: %s %d\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x10ac);
            open_multi_files_kvs_test()::__test_pass = 1;
            __assert_fail("status == FDB_RESULT_SUCCESS",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                          ,0x10ac,"void open_multi_files_kvs_test()");
          }
        }
        lVar7 = lVar7 + 1;
      } while( true );
    }
    sprintf(fname,"dummy%d",uVar8 & 0xffffffff);
    fVar2 = fdb_open(local_44b8 + uVar8,fname,&fconfig);
    if (fVar2 != FDB_RESULT_SUCCESS) break;
    lVar7 = 0;
    local_44e0 = uVar8;
    local_44d8 = ppfVar6;
    while (lVar7 != 0x80) {
      sprintf(fname,"kvs%d",(ulong)(uint)((int)lVar7 + iVar3));
      fVar2 = fdb_kvs_open(local_44b8[uVar8],ppfVar6,fname,&kvs_config);
      lVar7 = lVar7 + 1;
      ppfVar6 = ppfVar6 + 1;
      if (fVar2 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0x10a1);
        open_multi_files_kvs_test()::__test_pass = 1;
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0x10a1,"void open_multi_files_kvs_test()");
      }
    }
    uVar8 = local_44e0 + 1;
    ppfVar6 = local_44d8 + 0x80;
    iVar3 = iVar3 + 0x80;
  }
  fprintf(_stderr,"Test failed: %s %d\n",
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
          ,0x109c);
  open_multi_files_kvs_test()::__test_pass = 1;
  __assert_fail("status == FDB_RESULT_SUCCESS",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0x109c,"void open_multi_files_kvs_test()");
}

Assistant:

void open_multi_files_kvs_test()
{
    TEST_INIT();
    memleak_start();

    int i, j, r;
    int vb;
    int n = 10;
    int n_files = 8;
    int n_kvs = 128;
    char keybuf[256], bodybuf[256];
    char fname[256];

    fdb_file_handle **dbfiles = alca(fdb_file_handle*, n_files);
    fdb_kvs_handle **kvs = alca(fdb_kvs_handle*, n_files*n_kvs);
    fdb_kvs_handle **snap_kvs = alca(fdb_kvs_handle*, n_files*n_kvs);
    fdb_iterator *iterator;
    fdb_doc *rdoc;
    fdb_kvs_info kvs_info;
    fdb_status status;

    // remove previous dummy test files
    r = system(SHELL_DEL" dummy* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.wal_threshold = 1024;
    fconfig.compaction_mode = FDB_COMPACTION_MANUAL;
    fconfig.durability_opt = FDB_DRB_ASYNC;

    // 1024 kvs via 128 per dbfile
    for(j=0;j<n_files;++j){
        sprintf(fname, "dummy%d", j);
        status = fdb_open(&dbfiles[j], fname, &fconfig);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        for(i=0;i<n_kvs;++i){
            vb = j*n_kvs+i;
            sprintf(fname, "kvs%d", vb);
            status = fdb_kvs_open(dbfiles[j], &kvs[vb], fname, &kvs_config);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
        }
    }

    // load across all kvs
    vb = n_files*n_kvs;
    for(i=0;i<vb;++i){
        for(j=0;j<n;++j){
            sprintf(keybuf, "key%08d", j);
            sprintf(bodybuf, "value%08d", j);
            status = fdb_set_kv(kvs[i], keybuf, strlen(keybuf)+1, bodybuf, strlen(bodybuf)+1);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
        }
    }

    // commit
    for(j=0;j<n_files;++j){
        if((j%2)==0){
            status = fdb_commit(dbfiles[j], FDB_COMMIT_NORMAL);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
        } else {
            status = fdb_commit(dbfiles[j], FDB_COMMIT_MANUAL_WAL_FLUSH);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
        }
    }

    // snapshot 1 kvs per file
    for(i=0;i<vb;i+=n_kvs){
        fdb_get_kvs_info(kvs[i], &kvs_info);
        TEST_CHK(kvs_info.last_seqnum == (uint64_t)n);
        status = fdb_snapshot_open(kvs[i], &snap_kvs[i], kvs_info.last_seqnum);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }

    // compact default
    for(j=0;j<n_files;++j){
        status = fdb_compact(dbfiles[j], NULL);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }

    // iterate over snapshots
    rdoc = NULL;
    for(i=0;i<vb;i+=n_kvs){
        j=0;
        fdb_iterator_init(snap_kvs[i], &iterator, NULL, 0, NULL, 0, FDB_ITR_NONE);
        do {
            // verify keys
            status = fdb_iterator_get(iterator, &rdoc);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            sprintf(keybuf, "key%08d", j);
            TEST_CHK(!strcmp(keybuf, (char *)rdoc->key));
            j++;
        } while(fdb_iterator_next(iterator) != FDB_RESULT_ITERATOR_FAIL);
        fdb_iterator_close(iterator);
    }
    fdb_doc_free(rdoc);

    // delete all keys
    vb = n_files*n_kvs;
    for(i=0;i<vb;++i){
        for(j=0;j<n;++j){
            sprintf(keybuf, "key%08d", j);
            status = fdb_del_kv(kvs[i], keybuf, strlen(keybuf)+1);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
        }
    }


    // custom compact
    for(j=0;j<n_files;++j){
        sprintf(fname, "dummy_compact%d", j);
        status = fdb_compact(dbfiles[j], fname);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }

    // iterate again over actual kvs with no deletes
    rdoc = NULL;
    for(i=0;i<vb;i+=n_kvs){
        status = fdb_iterator_init(kvs[i], &iterator, NULL, 0, NULL, 0, FDB_ITR_NO_DELETES);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        do {
            // verify keys
            status = fdb_iterator_get(iterator, &rdoc);
            TEST_CHK(status != FDB_RESULT_SUCCESS);
        } while(fdb_iterator_next(iterator) != FDB_RESULT_ITERATOR_FAIL);
        fdb_iterator_close(iterator);
    }
    fdb_doc_free(rdoc);


    // cleanup
    for(j=0;j<n_files;++j){
        status = fdb_close(dbfiles[j]);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }

    fdb_shutdown();
    memleak_end();

    TEST_RESULT("open multi files kvs test");
}